

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void codecomp(FuncState *fs,OpCode op,int cond,expdesc *e1,expdesc *e2)

{
  int iVar1;
  undefined4 *in_RCX;
  int in_EDX;
  int in_ESI;
  int temp;
  int o2;
  int o1;
  int in_stack_ffffffffffffffc8;
  OpCode in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  iVar1 = luaK_exp2RK((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (expdesc *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  luaK_exp2RK((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
              (expdesc *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  freeexp((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  freeexp((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if ((in_EDX == 0) && (in_ESI != 0x17)) {
    in_stack_ffffffffffffffd4 = iVar1;
  }
  iVar1 = condjump((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0,0x119468);
  in_RCX[2] = iVar1;
  *in_RCX = 10;
  return;
}

Assistant:

static void codecomp(FuncState*fs,OpCode op,int cond,expdesc*e1,
expdesc*e2){
int o1=luaK_exp2RK(fs,e1);
int o2=luaK_exp2RK(fs,e2);
freeexp(fs,e2);
freeexp(fs,e1);
if(cond==0&&op!=OP_EQ){
int temp;
temp=o1;o1=o2;o2=temp;
cond=1;
}
e1->u.s.info=condjump(fs,op,cond,o1,o2);
e1->k=VJMP;
}